

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O3

void R_SWRSetWindow(int windowSize,int fullWidth,int fullHeight,int stHeight,int trueratio)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  undefined2 uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar17;
  undefined1 auVar15 [16];
  int iVar18;
  undefined1 auVar16 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar32;
  undefined1 auVar30 [16];
  int iVar33;
  int iVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar38 [16];
  char temp [16];
  char acStack_38 [24];
  long lVar11;
  
  if (!bRenderingToCanvas) {
    mysnprintf(acStack_38,0x10,"%d x %d",(ulong)(uint)viewwidth,(ulong)(uint)viewheight);
    FBaseCVar::ForceSet(&r_viewsize.super_FBaseCVar,(UCVarValue)acStack_38,CVAR_String,false);
  }
  iVar5 = viewheight;
  auVar4 = _DAT_0073b300;
  fuzzviewheight = viewheight + -2;
  CenterX = (double)centerx;
  CenterY = (double)centery;
  if (trueratio == 4) {
    iVar32 = (fullHeight * 0x2d) / 0x30;
    iVar31 = fullWidth;
  }
  else {
    iVar31 = (BaseRatioSizes[trueratio][3] * fullWidth) / 0x30;
    iVar32 = fullHeight;
  }
  if ((long)WidescreenRatio == 4) {
    fullHeight = (fullHeight * 0x2d) / 0x30;
  }
  else {
    fullWidth = (fullWidth * BaseRatioSizes[WidescreenRatio][3]) / 0x30;
  }
  BaseYaspectMul = ((double)iVar32 * 320.0) / ((double)iVar31 * 200.0);
  YaspectMul = ((double)fullHeight * 320.0) / ((double)fullWidth * 200.0);
  IYaspectMul = ((double)fullWidth * 0.625) / (double)fullHeight;
  pspritexscale = (double)centerxwide * 0.00625;
  pspriteyscale = pspritexscale * YaspectMul;
  InvZtoScale = YaspectMul * CenterX;
  WallTMapScale2 = IYaspectMul / CenterX;
  pspritexiscale = 160.0 / (double)centerxwide;
  uVar7 = (ulong)(uint)viewwidth;
  if (uVar7 != 0) {
    lVar11 = uVar7 - 1;
    auVar9._8_4_ = (int)lVar11;
    auVar9._0_8_ = lVar11;
    auVar9._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar8 = 0;
    auVar10 = _DAT_0073c180;
    auVar12 = _DAT_0073c190;
    auVar13 = _DAT_0073c1a0;
    auVar14 = _DAT_0073b2f0;
    do {
      auVar15 = auVar9 ^ auVar4;
      auVar19 = auVar14 ^ auVar4;
      iVar31 = auVar15._0_4_;
      iVar33 = -(uint)(iVar31 < auVar19._0_4_);
      iVar32 = auVar15._4_4_;
      auVar20._4_4_ = -(uint)(iVar32 < auVar19._4_4_);
      iVar17 = auVar15._8_4_;
      iVar36 = -(uint)(iVar17 < auVar19._8_4_);
      iVar18 = auVar15._12_4_;
      auVar20._12_4_ = -(uint)(iVar18 < auVar19._12_4_);
      auVar27._4_4_ = iVar33;
      auVar27._0_4_ = iVar33;
      auVar27._8_4_ = iVar36;
      auVar27._12_4_ = iVar36;
      auVar37 = pshuflw(in_XMM12,auVar27,0xe8);
      auVar22._4_4_ = -(uint)(auVar19._4_4_ == iVar32);
      auVar22._12_4_ = -(uint)(auVar19._12_4_ == iVar18);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar38 = pshuflw(in_XMM13,auVar22,0xe8);
      auVar20._0_4_ = auVar20._4_4_;
      auVar20._8_4_ = auVar20._12_4_;
      auVar19 = pshuflw(auVar37,auVar20,0xe8);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar15 = (auVar19 | auVar38 & auVar37) ^ auVar15;
      auVar15 = packssdw(auVar15,auVar15);
      uVar6 = (undefined2)iVar5;
      if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)screenheightarray + uVar8) = uVar6;
      }
      auVar20 = auVar22 & auVar27 | auVar20;
      auVar15 = packssdw(auVar20,auVar20);
      auVar19._8_4_ = 0xffffffff;
      auVar19._0_8_ = 0xffffffffffffffff;
      auVar19._12_4_ = 0xffffffff;
      auVar15 = packssdw(auVar15 ^ auVar19,auVar15 ^ auVar19);
      if ((auVar15._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((long)screenheightarray + uVar8 + 2) = uVar6;
      }
      auVar15 = auVar13 ^ auVar4;
      iVar33 = -(uint)(iVar31 < auVar15._0_4_);
      auVar34._4_4_ = -(uint)(iVar32 < auVar15._4_4_);
      iVar36 = -(uint)(iVar17 < auVar15._8_4_);
      auVar34._12_4_ = -(uint)(iVar18 < auVar15._12_4_);
      auVar21._4_4_ = iVar33;
      auVar21._0_4_ = iVar33;
      auVar21._8_4_ = iVar36;
      auVar21._12_4_ = iVar36;
      auVar28._4_4_ = -(uint)(auVar15._4_4_ == iVar32);
      auVar28._12_4_ = -(uint)(auVar15._12_4_ == iVar18);
      auVar28._0_4_ = auVar28._4_4_;
      auVar28._8_4_ = auVar28._12_4_;
      auVar34._0_4_ = auVar34._4_4_;
      auVar34._8_4_ = auVar34._12_4_;
      auVar15 = auVar28 & auVar21 | auVar34;
      auVar15 = packssdw(auVar15,auVar15);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar15 = packssdw(auVar15 ^ auVar1,auVar15 ^ auVar1);
      if ((auVar15 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)screenheightarray + uVar8 + 4) = uVar6;
      }
      auVar19 = pshufhw(auVar21,auVar21,0x84);
      auVar20 = pshufhw(auVar28,auVar28,0x84);
      auVar22 = pshufhw(auVar19,auVar34,0x84);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar23 = (auVar22 | auVar20 & auVar19) ^ auVar23;
      auVar19 = packssdw(auVar23,auVar23);
      if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)screenheightarray + uVar8 + 6) = uVar6;
      }
      auVar19 = auVar12 ^ auVar4;
      iVar33 = -(uint)(iVar31 < auVar19._0_4_);
      auVar25._4_4_ = -(uint)(iVar32 < auVar19._4_4_);
      iVar36 = -(uint)(iVar17 < auVar19._8_4_);
      auVar25._12_4_ = -(uint)(iVar18 < auVar19._12_4_);
      auVar29._4_4_ = iVar33;
      auVar29._0_4_ = iVar33;
      auVar29._8_4_ = iVar36;
      auVar29._12_4_ = iVar36;
      auVar15 = pshuflw(auVar15,auVar29,0xe8);
      auVar24._4_4_ = -(uint)(auVar19._4_4_ == iVar32);
      auVar24._12_4_ = -(uint)(auVar19._12_4_ == iVar18);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar19 = pshuflw(auVar38 & auVar37,auVar24,0xe8);
      in_XMM13 = auVar19 & auVar15;
      auVar25._0_4_ = auVar25._4_4_;
      auVar25._8_4_ = auVar25._12_4_;
      auVar15 = pshuflw(auVar15,auVar25,0xe8);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar37 = (auVar15 | in_XMM13) ^ auVar37;
      auVar15 = packssdw(auVar37,auVar37);
      if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)screenheightarray + uVar8 + 8) = uVar6;
      }
      auVar25 = auVar24 & auVar29 | auVar25;
      auVar15 = packssdw(auVar25,auVar25);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar15 = packssdw(auVar15 ^ auVar38,auVar15 ^ auVar38);
      if ((auVar15 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)screenheightarray + uVar8 + 10) = uVar6;
      }
      auVar15 = auVar10 ^ auVar4;
      auVar35._0_4_ = -(uint)(iVar31 < auVar15._0_4_);
      auVar35._4_4_ = -(uint)(iVar32 < auVar15._4_4_);
      auVar35._8_4_ = -(uint)(iVar17 < auVar15._8_4_);
      auVar35._12_4_ = -(uint)(iVar18 < auVar15._12_4_);
      auVar26._4_4_ = auVar35._0_4_;
      auVar26._0_4_ = auVar35._0_4_;
      auVar26._8_4_ = auVar35._8_4_;
      auVar26._12_4_ = auVar35._8_4_;
      iVar31 = -(uint)(auVar15._4_4_ == iVar32);
      iVar32 = -(uint)(auVar15._12_4_ == iVar18);
      auVar16._4_4_ = iVar31;
      auVar16._0_4_ = iVar31;
      auVar16._8_4_ = iVar32;
      auVar16._12_4_ = iVar32;
      auVar30._4_4_ = auVar35._4_4_;
      auVar30._0_4_ = auVar35._4_4_;
      auVar30._8_4_ = auVar35._12_4_;
      auVar30._12_4_ = auVar35._12_4_;
      in_XMM12 = auVar16 & auVar26 | auVar30;
      auVar15 = packssdw(auVar35,in_XMM12);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar15 = packssdw(auVar15 ^ auVar2,auVar15 ^ auVar2);
      if ((auVar15 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)screenheightarray + uVar8 + 0xc) = uVar6;
      }
      auVar19 = pshufhw(auVar26,auVar26,0x84);
      auVar15 = pshufhw(auVar16,auVar16,0x84);
      auVar22 = pshufhw(auVar19,auVar30,0x84);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar15 = packssdw(auVar15 & auVar19,(auVar22 | auVar15 & auVar19) ^ auVar3);
      if ((auVar15 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)screenheightarray + uVar8 + 0xe) = uVar6;
      }
      lVar11 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 8;
      auVar14._8_8_ = lVar11 + 8;
      lVar11 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 8;
      auVar13._8_8_ = lVar11 + 8;
      lVar11 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 8;
      auVar12._8_8_ = lVar11 + 8;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 8;
      auVar10._8_8_ = lVar11 + 8;
      uVar8 = uVar8 + 0x10;
    } while ((uVar7 * 2 + 0xe & 0xfffffffffffffff0) != uVar8);
  }
  R_InitTextureMapping();
  MaxVisForWall =
       (FocalTangent * 32767.0 *
       (double)((screen->super_DSimpleCanvas).super_DCanvas.Height * viewwidth)) /
       (InvZtoScale * 200.0 * (double)(screen->super_DSimpleCanvas).super_DCanvas.Width);
  MaxVisForFloor = 5242720.0 / ((double)viewheight * FocalLengthY);
  R_SetVisibility(CurrentVisibility);
  return;
}

Assistant:

void R_SWRSetWindow(int windowSize, int fullWidth, int fullHeight, int stHeight, int trueratio)
{
	int virtheight, virtwidth, virtwidth2, virtheight2;

	if (!bRenderingToCanvas)
	{ // Set r_viewsize cvar to reflect the current view size
		UCVarValue value;
		char temp[16];

		mysnprintf (temp, countof(temp), "%d x %d", viewwidth, viewheight);
		value.String = temp;
		r_viewsize.ForceSet (value, CVAR_String);
	}

	fuzzviewheight = viewheight - 2;	// Maximum row the fuzzer can draw to

	lastcenteryfrac = 1<<30;
	CenterX = centerx;
	CenterY = centery;

	virtwidth = virtwidth2 = fullWidth;
	virtheight = virtheight2 = fullHeight;

	if (Is54Aspect(trueratio))
	{
		virtheight2 = virtheight2 * BaseRatioSizes[trueratio][3] / 48;
	}
	else
	{
		virtwidth2 = virtwidth2 * BaseRatioSizes[trueratio][3] / 48;
	}

	if (Is54Aspect(WidescreenRatio))
	{
		virtheight = virtheight * BaseRatioSizes[WidescreenRatio][3] / 48;
	}
	else
	{
		virtwidth = virtwidth * BaseRatioSizes[WidescreenRatio][3] / 48;
	}

	BaseYaspectMul = 320.0 * virtheight2 / (r_Yaspect * virtwidth2);
	YaspectMul = 320.0 * virtheight / (r_Yaspect * virtwidth);
	IYaspectMul = (double)virtwidth * r_Yaspect / 320.0 / virtheight;
	InvZtoScale = YaspectMul * CenterX;

	WallTMapScale2 = IYaspectMul / CenterX;

	// psprite scales
	pspritexscale = centerxwide / 160.0;
	pspriteyscale = pspritexscale * YaspectMul;
	pspritexiscale = 1 / pspritexscale;

	// thing clipping
	clearbufshort (screenheightarray, viewwidth, (short)viewheight);

	R_InitTextureMapping ();

	MaxVisForWall = (InvZtoScale * (SCREENWIDTH*r_Yaspect) /
		(viewwidth*SCREENHEIGHT * FocalTangent));
	MaxVisForWall = 32767.0 / MaxVisForWall;
	MaxVisForFloor = 32767.0 / (viewheight * FocalLengthY / 160);

	// Reset r_*Visibility vars
	R_SetVisibility(R_GetVisibility());
}